

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result * validateLayerAndLossLayerNamesCollisions<CoreML::Specification::NeuralNetworkRegressor>
                   (Result *__return_storage_ptr__,NeuralNetworkRegressor *nn)

{
  undefined4 uVar1;
  int iVar2;
  NeuralNetworkLayer *this;
  string *psVar3;
  size_type sVar4;
  NetworkUpdateParameters *this_00;
  LossLayer *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string lossLayerName;
  int j;
  NetworkUpdateParameters *updateParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_b8 [8];
  string layerName;
  undefined1 local_90 [4];
  int i;
  string err;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  setOfNames;
  Result r;
  NeuralNetworkRegressor *nn_local;
  
  CoreML::Result::Result((Result *)&setOfNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)local_90);
  layerName.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = layerName.field_2._12_4_;
    iVar2 = CoreML::Specification::NeuralNetworkRegressor::layers_size(nn);
    if (iVar2 <= (int)uVar1) break;
    this = CoreML::Specification::NeuralNetworkRegressor::layers(nn,layerName.field_2._12_4_);
    psVar3 = CoreML::Specification::NeuralNetworkLayer::name_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_b8,(string *)psVar3);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&err.field_2 + 8),(key_type *)local_b8);
    if (sVar4 == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&err.field_2 + 8),(value_type *)local_b8);
    }
    else {
      std::operator+(&local_108,"The updatable model has a name collision for: \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::operator+(&local_e8,&local_108,
                     "\', i.e., there are more than one layers or loss layers with this name.");
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_90);
    }
    std::__cxx11::string::~string((string *)local_b8);
    if (sVar4 != 0) goto LAB_009ac555;
    layerName.field_2._12_4_ = layerName.field_2._12_4_ + 1;
  }
  this_00 = CoreML::Specification::NeuralNetworkRegressor::updateparams(nn);
  lossLayerName.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = lossLayerName.field_2._12_4_;
    iVar2 = CoreML::Specification::NetworkUpdateParameters::losslayers_size(this_00);
    if (iVar2 <= (int)uVar1) break;
    this_01 = CoreML::Specification::NetworkUpdateParameters::losslayers
                        (this_00,lossLayerName.field_2._12_4_);
    psVar3 = CoreML::Specification::LossLayer::name_abi_cxx11_(this_01);
    std::__cxx11::string::string((string *)local_150,(string *)psVar3);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&err.field_2 + 8),(key_type *)local_150);
    if (sVar4 == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&err.field_2 + 8),(value_type *)local_150);
    }
    else {
      std::operator+(&local_190,"The updatable model has a name collision for: \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150)
      ;
      std::operator+(&local_170,&local_190,
                     "\', i.e., there are more than one layers or loss layers with this name.");
      std::__cxx11::string::operator=((string *)local_90,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_90);
    }
    std::__cxx11::string::~string((string *)local_150);
    if (sVar4 != 0) goto LAB_009ac555;
    lossLayerName.field_2._12_4_ = lossLayerName.field_2._12_4_ + 1;
  }
  CoreML::Result::Result
            (__return_storage_ptr__,
             (Result *)&setOfNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_009ac555:
  std::__cxx11::string::~string((string *)local_90);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&err.field_2 + 8));
  CoreML::Result::~Result((Result *)&setOfNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

static Result validateLayerAndLossLayerNamesCollisions(const T& nn) {
    Result r;
    std::set<std::string> setOfNames;
    std::string err;
    
    for (int i = 0; i < nn.layers_size(); i++) {
        std::string layerName = nn.layers(i).name();
        if (setOfNames.count(layerName)) {
            err = "The updatable model has a name collision for: '" + layerName + "', i.e., there are more than one layers or loss layers with this name.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
        }
        setOfNames.insert(layerName);
    }
    
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    for (int j = 0; j < updateParams.losslayers_size(); j++) {
        std::string lossLayerName = updateParams.losslayers(j).name();
        if (setOfNames.count(lossLayerName)) {
            err = "The updatable model has a name collision for: '" + lossLayerName + "', i.e., there are more than one layers or loss layers with this name.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
        }
        setOfNames.insert(lossLayerName);
    }
    
    return r;
}